

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.C
# Opt level: O3

CmdLineArg * __thiscall
CmdLine::next(CmdLineArg *__return_storage_ptr__,CmdLine *this,int argc,char **argv)

{
  char cVar1;
  int iVar2;
  char *__s;
  CmdLineOption *pCVar3;
  int iVar4;
  size_t __n;
  char *pcVar5;
  char cVar6;
  CmdLineOption *pCVar7;
  char local_59;
  char *local_58;
  
  iVar2 = this->_idx;
  this->_idx = iVar2 + 1;
  if (argc <= iVar2 + 1) {
    __return_storage_ptr__->_what = '\0';
    __return_storage_ptr__->_name = (char *)0x0;
    __return_storage_ptr__->_opt = (char *)0x0;
    return __return_storage_ptr__;
  }
  pcVar5 = argv[(long)iVar2 + 1];
  if (*pcVar5 != '-') {
    __return_storage_ptr__->_what = '\x01';
    goto LAB_00107271;
  }
  cVar1 = pcVar5[1];
  if (cVar1 == '\0') {
LAB_001071a9:
    __return_storage_ptr__->_what = '\x02';
  }
  else {
    if (cVar1 == '-') {
      if (pcVar5[2] == '\0') goto LAB_001071a9;
      local_58 = pcVar5 + 2;
      local_59 = pcVar5[2];
    }
    else {
      local_58 = pcVar5 + 1;
      local_59 = cVar1;
    }
    pCVar7 = this->_opts;
    cVar6 = pCVar7->shortName;
    while (cVar6 != '\0') {
      if (cVar1 == '-') {
        __s = pCVar7->longName;
        if (__s != (char *)0x0) {
          __n = strlen(__s);
          iVar4 = strncmp(local_58,__s,__n);
          if ((iVar4 == 0) && ((local_58[__n] == '\0' || (local_58[__n] == '='))))
          goto LAB_0010723b;
        }
      }
      else if (local_59 == cVar6) {
        __n = 1;
LAB_0010723b:
        cVar1 = local_58[__n];
        if (pCVar7->flag != RequiredArgument) {
          if (cVar1 == '\0') {
            pcVar5 = pCVar7->longName;
            __return_storage_ptr__->_what = cVar6;
            goto LAB_00107271;
          }
          break;
        }
        if (cVar1 == '\0') {
          this->_idx = iVar2 + 2;
          if (argc <= iVar2 + 2) {
            __return_storage_ptr__->_what = '\x03';
            goto LAB_00107271;
          }
          pcVar5 = pCVar7->longName;
          local_58 = argv[(long)iVar2 + 2];
        }
        else {
          if (cVar1 != '=') break;
          local_58 = local_58 + __n + 1;
          pcVar5 = pCVar7->longName;
        }
        __return_storage_ptr__->_what = cVar6;
        __return_storage_ptr__->_name = pcVar5;
        __return_storage_ptr__->_opt = local_58;
        return __return_storage_ptr__;
      }
      pCVar3 = pCVar7 + 1;
      pCVar7 = pCVar7 + 1;
      cVar6 = pCVar3->shortName;
    }
    __return_storage_ptr__->_what = '\x02';
  }
LAB_00107271:
  __return_storage_ptr__->_name = pcVar5;
  __return_storage_ptr__->_opt = (char *)0x0;
  return __return_storage_ptr__;
}

Assistant:

CmdLineArg const CmdLine::next(int argc, char * argv[])
{
    ++_idx;
    if (_idx >= argc) {
        return CmdLineArg();
    }

    char const * arg = argv[_idx];

    // Is it a command line argument?
    if (*arg != '-') {
        return CmdLineArg(CmdLineArg::NO_OPTION, argv[_idx]);
    }

    // Otherwise it is a short or long command line option
    bool longOpt = false;
    if (*arg == '-') {
        ++arg;
        if (*arg == '\0') {
            return CmdLineArg(CmdLineArg::INVALID_OPTION, argv[_idx]);
        }
    }
    if (*arg == '-') {
        ++arg;
        if (*arg == '\0') {
            return CmdLineArg(CmdLineArg::INVALID_OPTION, argv[_idx]);
        }
        longOpt = true;
    }

    // The rest shall be the command line option
    CmdLineOption const * opt = _opts;
    char const * end = nullptr;
    for (; opt->shortName != '\0'; ++opt) {
        if (longOpt) {
            if (opt->longName != nullptr && strncmp(arg, opt->longName, strlen(opt->longName)) == 0) {
                end = arg + strlen(opt->longName);
                // Shall end with '\0' or '='
                if (*end == '\0' || *end == '=') {
                    break;
                }
                // Otherwise keep looking for matches
                end = nullptr;
            }
        }
        else {
            if (*arg == opt->shortName) {
                end = arg + 1;
                break;
            }
        }
    }

    // Is it an invalid option
    if (opt->shortName == '\0' || end == nullptr) {
        return CmdLineArg(CmdLineArg::INVALID_OPTION, argv[_idx]);
    }

    // Does it require arguments?
    if (opt->flag == CmdLineOption::RequiredArgument) {
        // Shall end with '=' or '\0'
        if (*end == '=') {
            ++end;
            return CmdLineArg(opt->shortName, opt->longName, end);
        }
        else if (*end == '\0') {
            // Argument is next
            ++_idx;
            if (_idx >= argc) {
                return CmdLineArg(CmdLineArg::REQUIRES_ARGUMENT, argv[_idx - 1]);
            }
            return CmdLineArg(opt->shortName, opt->longName, argv[_idx]);
        }
    }

    // Does not require arguments; end shall be '\0'
    if (*end == '\0') {
        return CmdLineArg(opt->shortName, opt->longName);
    }

    // Otherwise this is an invalid option
    return CmdLineArg(CmdLineArg::INVALID_OPTION, argv[_idx]);
}